

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Ref<embree::Image> __thiscall embree::loadImageFromDisk(embree *this,FileName *fileName)

{
  bool bVar1;
  runtime_error *this_00;
  string ext;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  FileName::ext_abi_cxx11_(&local_60,fileName);
  toLowerCase(&ext,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = std::operator==(&ext,"bmp");
  if (!bVar1) {
    bVar1 = std::operator==(&ext,"png");
    if (!bVar1) {
      bVar1 = std::operator==(&ext,"jpg");
      if (!bVar1) {
        bVar1 = std::operator==(&ext,"exr");
        if (bVar1) {
          loadEXR(this,fileName);
        }
        else {
          bVar1 = std::operator==(&ext,"pfm");
          if (bVar1) {
            loadPFM(this,fileName);
          }
          else {
            bVar1 = std::operator==(&ext,"ppm");
            if (bVar1) {
              loadPPM(this,fileName);
            }
            else {
              bVar1 = std::operator==(&ext,"tga");
              if (!bVar1) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_40,"image format ",&ext);
                std::operator+(&local_60,&local_40," not supported");
                std::runtime_error::runtime_error(this_00,(string *)&local_60);
                __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              loadTGA(this,fileName);
            }
          }
        }
        goto LAB_00197294;
      }
    }
  }
  loadSTB(this,fileName);
LAB_00197294:
  std::__cxx11::string::~string((string *)&ext);
  return (Ref<embree::Image>)(Image *)this;
}

Assistant:

Ref<Image> loadImageFromDisk(const FileName& fileName)
  {
    std::string ext = toLowerCase(fileName.ext());

    if (ext == "bmp" ) return loadSTB(fileName);
    if (ext == "png" ) return loadSTB(fileName);
    if (ext == "jpg" ) return loadSTB(fileName);

    if (ext == "exr" ) return loadEXR(fileName);
    
    if (ext == "pfm" ) return loadPFM(fileName);
    if (ext == "ppm" ) return loadPPM(fileName);
    if (ext == "tga" ) return loadTGA(fileName);
    THROW_RUNTIME_ERROR("image format " + ext + " not supported");
  }